

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O0

bool __thiscall
cmConditionEvaluator::IsKeyword
          (cmConditionEvaluator *this,string *keyword,cmExpandedCommandArgument *argument)

{
  bool bVar1;
  string *psVar2;
  ostream *poVar3;
  cmake *this_00;
  PolicyID id;
  string local_1f8;
  string local_1c8;
  undefined1 local_1a8 [8];
  ostringstream e;
  bool isKeyword;
  cmExpandedCommandArgument *argument_local;
  string *keyword_local;
  cmConditionEvaluator *this_local;
  
  if (((this->Policy54Status == WARN) || (this->Policy54Status == OLD)) ||
     (bVar1 = cmExpandedCommandArgument::WasQuoted(argument), !bVar1)) {
    psVar2 = cmExpandedCommandArgument::GetValue_abi_cxx11_(argument);
    this_local._7_1_ = std::operator==(psVar2,keyword);
    if (((this_local._7_1_) && (bVar1 = cmExpandedCommandArgument::WasQuoted(argument), bVar1)) &&
       ((this->Policy54Status == WARN &&
        (bVar1 = cmMakefile::HasCMP0054AlreadyBeenReported(this->Makefile,&this->ExecutionContext),
        !bVar1)))) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c8,(cmPolicies *)0x36,id);
      poVar3 = std::operator<<((ostream *)local_1a8,(string *)&local_1c8);
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string((string *)&local_1c8);
      poVar3 = std::operator<<((ostream *)local_1a8,"Quoted keywords like \"");
      psVar2 = cmExpandedCommandArgument::GetValue_abi_cxx11_(argument);
      poVar3 = std::operator<<(poVar3,(string *)psVar2);
      std::operator<<(poVar3,
                      "\" will no longer be interpreted as keywords when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                     );
      this_00 = cmMakefile::GetCMakeInstance(this->Makefile);
      std::__cxx11::ostringstream::str();
      cmake::IssueMessage(this_00,AUTHOR_WARNING,&local_1f8,&this->Backtrace);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmConditionEvaluator::IsKeyword(std::string const& keyword,
                                     cmExpandedCommandArgument& argument) const
{
  if ((this->Policy54Status != cmPolicies::WARN &&
       this->Policy54Status != cmPolicies::OLD) &&
      argument.WasQuoted()) {
    return false;
  }

  bool isKeyword = argument.GetValue() == keyword;

  if (isKeyword && argument.WasQuoted() &&
      this->Policy54Status == cmPolicies::WARN) {
    if (!this->Makefile.HasCMP0054AlreadyBeenReported(
          this->ExecutionContext)) {
      std::ostringstream e;
      e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0054) << "\n";
      e << "Quoted keywords like \"" << argument.GetValue()
        << "\" will no longer be interpreted as keywords "
           "when the policy is set to NEW.  "
           "Since the policy is not set the OLD behavior will be used.";

      this->Makefile.GetCMakeInstance()->IssueMessage(
        MessageType::AUTHOR_WARNING, e.str(), this->Backtrace);
    }
  }

  return isKeyword;
}